

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::parse(Reader *this,string *document,Value *root,bool collectComments)

{
  char *beginDoc;
  bool bVar1;
  
  std::__cxx11::string::replace
            ((ulong)&this->document_,0,(char *)(this->document_)._M_string_length,
             (ulong)(document->_M_dataplus)._M_p);
  beginDoc = (this->document_)._M_dataplus._M_p;
  bVar1 = parse(this,beginDoc,beginDoc + (this->document_)._M_string_length,root,collectComments);
  return bVar1;
}

Assistant:

bool Reader::parse(const std::string& document, Value& root,
                   bool collectComments) {
  document_.assign(document.begin(), document.end());
  const char* begin = document_.c_str();
  const char* end = begin + document_.length();
  return parse(begin, end, root, collectComments);
}